

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  char cVar1;
  undefined7 uVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  ulong _pos;
  size_t sVar7;
  string remainder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string wrappableChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar5 = _attr->indent;
  sVar7 = _attr->width;
  cVar1 = _attr->tabChar;
  uVar2 = *(undefined7 *)&_attr->field_0x19;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar5;
  (this->attr).width = sVar7;
  (this->attr).tabChar = cVar1;
  *(undefined7 *)&(this->attr).field_0x19 = uVar2;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&wrappableChars," [({.,/|\\-",(allocator *)&remainder);
  sVar5 = _attr->initialIndent;
  sVar7 = _attr->indent;
  std::__cxx11::string::string((string *)&remainder,(string *)_str);
  if (sVar5 != 0xffffffffffffffff) {
    sVar7 = sVar5;
  }
  do {
    if (remainder._M_string_length == 0) {
LAB_00144cf7:
      std::__cxx11::string::~string((string *)&remainder);
      std::__cxx11::string::~string((string *)&wrappableChars);
      return;
    }
    if (0x7ce0 < (ulong)((long)(this->lines).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::string
                ((string *)&local_b0,"... message truncated due to excessive size",
                 (allocator *)&local_90);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines,
                 &local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_00144cf7;
    }
    _pos = _attr->width - sVar7;
    if (remainder._M_string_length <= _pos) {
      _pos = remainder._M_string_length;
    }
    uVar3 = std::__cxx11::string::find((char)&remainder,10);
    if (uVar3 < _pos) {
      _pos = uVar3;
    }
    lVar4 = std::__cxx11::string::rfind((char)&remainder,(ulong)(uint)(int)_attr->tabChar);
    if (lVar4 != -1) {
      cVar1 = remainder._M_dataplus._M_p[_pos];
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&remainder);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&remainder);
      std::operator+(&local_b0,&local_90,&local_50);
      _pos = _pos - (cVar1 == '\n');
      std::__cxx11::string::operator=((string *)&remainder,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (_pos == remainder._M_string_length) {
      spliceLine(this,sVar7,&remainder,_pos);
    }
    else if (remainder._M_dataplus._M_p[_pos] == '\n') {
      spliceLine(this,sVar7,&remainder,_pos);
      if ((_pos < 2) || (remainder._M_string_length != 1)) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&remainder);
        std::__cxx11::string::operator=((string *)&remainder,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      sVar7 = _attr->indent;
    }
    else {
      sVar5 = std::__cxx11::string::find_last_of((string *)&remainder,(ulong)&wrappableChars);
      if (sVar5 - 1 < 0xfffffffffffffffe) {
        spliceLine(this,sVar7,&remainder,sVar5);
        if (*remainder._M_dataplus._M_p == ' ') {
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&remainder);
          std::__cxx11::string::operator=((string *)&remainder,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      else {
        spliceLine(this,sVar7,&remainder,_pos - 1);
        std::__cxx11::string::append
                  ((char *)((this->lines).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1));
      }
      if ((long)(this->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        sVar7 = _attr->indent;
      }
      lVar6 = 0;
      if (lVar4 != -1) {
        lVar6 = lVar4;
      }
      sVar7 = sVar7 + lVar6;
    }
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }